

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O0

void Abc_NtkDropOneOutput(Abc_Ntk_t *pNtk,int iOutput,int fSkipSweep,int fUseConst1)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pFaninOld;
  Abc_Obj_t *pFaninNew;
  Abc_Obj_t *pConst0;
  Abc_Obj_t *pObj;
  int fUseConst1_local;
  int fSkipSweep_local;
  int iOutput_local;
  Abc_Ntk_t *pNtk_local;
  
  pAVar2 = Abc_NtkPo(pNtk,iOutput);
  pAVar3 = Abc_ObjFanin0(pAVar2);
  pAVar4 = Abc_AigConst1(pNtk);
  if (pAVar3 == pAVar4) {
    iVar1 = Abc_ObjFaninC0(pAVar2);
    if ((uint)((iVar1 != 0 ^ 0xffU) & 1) != fUseConst1) {
      Abc_ObjXorFaninC(pAVar2,0);
    }
  }
  else {
    pAVar3 = Abc_AigConst1(pNtk);
    pAVar3 = Abc_ObjNotCond(pAVar3,(uint)((fUseConst1 != 0 ^ 0xffU) & 1));
    iVar1 = Abc_ObjFaninC0(pAVar2);
    pAVar4 = Abc_ObjNotCond(pAVar3,iVar1);
    pFaninOld = Abc_ObjFanin0(pAVar2);
    Abc_ObjPatchFanin(pAVar2,pFaninOld,pAVar4);
    pAVar2 = Abc_ObjChild0(pAVar2);
    if (pAVar2 != pAVar3) {
      __assert_fail("Abc_ObjChild0(pObj) == pConst0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                    ,0x730,"void Abc_NtkDropOneOutput(Abc_Ntk_t *, int, int, int)");
    }
    if (fSkipSweep == 0) {
      Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
    }
  }
  return;
}

Assistant:

void Abc_NtkDropOneOutput( Abc_Ntk_t * pNtk, int iOutput, int fSkipSweep, int fUseConst1 )
{
    Abc_Obj_t * pObj, * pConst0, * pFaninNew;
    pObj = Abc_NtkPo( pNtk, iOutput );
    if ( Abc_ObjFanin0(pObj) == Abc_AigConst1(pNtk) )
    {
        if ( !Abc_ObjFaninC0(pObj) ^ fUseConst1 )
            Abc_ObjXorFaninC( pObj, 0 );
        return;
    }
    pConst0 = Abc_ObjNotCond( Abc_AigConst1(pNtk), !fUseConst1 );
    pFaninNew = Abc_ObjNotCond( pConst0, Abc_ObjFaninC0(pObj) );
    Abc_ObjPatchFanin( pObj, Abc_ObjFanin0(pObj), pFaninNew );
    assert( Abc_ObjChild0(pObj) == pConst0 );
    if ( fSkipSweep )
        return;
    Abc_AigCleanup( (Abc_Aig_t *)pNtk->pManFunc );
}